

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall cs::repl::exec(repl *this,string *code)

{
  iterator *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  size_type sVar4;
  element_type *peVar5;
  _Elt_pointer pbVar6;
  size_t sVar7;
  pointer pcVar8;
  string *code_00;
  bool bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  exception *peVar14;
  long *plVar15;
  size_type *psVar16;
  size_type sVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  string version_str;
  string line;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string *local_1d0;
  repl *local_1c8;
  pointer local_1c0;
  string *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->line_num = this->line_num + 1;
  sVar4 = code->_M_string_length;
  local_1d0 = code;
  if (sVar4 == 0) {
    iVar19 = 0;
    bVar20 = true;
  }
  else {
    local_1c0 = (code->_M_dataplus)._M_p;
    local_1b8 = &this->cmd_buff;
    sVar17 = 0;
    iVar19 = 0;
    local_1c8 = this;
    do {
      iVar18 = 0;
      if (iVar19 == 1) {
        iVar10 = isspace((int)local_1c0[sVar17]);
        iVar19 = 1;
        bVar20 = true;
        if (iVar10 == 0) {
          std::__cxx11::string::push_back((char)local_1b8);
        }
      }
      else if (iVar19 == 0) {
        cVar3 = local_1c0[sVar17];
        iVar10 = isspace((int)cVar3);
        iVar18 = 0;
        bVar20 = true;
        iVar19 = 0;
        bVar9 = true;
        if (iVar10 == 0) {
          if (cVar3 == '@') {
            iVar19 = 1;
          }
          else {
            if (cVar3 == '#') {
              peVar5 = (local_1c8->context).
                       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              pbVar6 = (peVar5->file_buff).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (pbVar6 == *(_Elt_pointer *)
                             ((long)&(peVar5->file_buff).
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
                std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_push_back_aux<>(&peVar5->file_buff);
              }
              else {
                (pbVar6->_M_dataplus)._M_p = (pointer)&pbVar6->field_2;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                piVar1 = &(peVar5->file_buff).
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
              iVar19 = 1;
              bVar9 = false;
              goto LAB_0015bf86;
            }
            iVar19 = -1;
          }
        }
        else {
LAB_0015bf86:
          bVar20 = bVar9;
          iVar18 = iVar19;
          iVar19 = 0;
        }
      }
      else {
        iVar18 = 2;
        bVar20 = false;
      }
      if (!bVar20) goto LAB_0015c054;
      sVar17 = sVar17 + 1;
    } while (sVar4 != sVar17);
    iVar18 = 2;
LAB_0015c054:
    bVar20 = iVar18 == 2;
    this = local_1c8;
  }
  code_00 = local_1d0;
  if (!bVar20) {
    return;
  }
  if (iVar19 == 0) {
    return;
  }
  if (iVar19 != 1) {
    peVar5 = (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (this->multi_line == true) {
      pbVar6 = (peVar5->file_buff).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar6 == *(_Elt_pointer *)
                     ((long)&(peVar5->file_buff).
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_push_back_aux<>(&peVar5->file_buff);
      }
      else {
        (pbVar6->_M_dataplus)._M_p = (pointer)&pbVar6->field_2;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        piVar1 = &(peVar5->file_buff).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::__cxx11::string::_M_append((char *)&this->line_buff,(ulong)(code_00->_M_dataplus)._M_p);
      return;
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &peVar5->file_buff,local_1d0);
    run(this,code_00);
    return;
  }
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::swap((string *)&this->cmd_buff);
  iVar19 = std::__cxx11::string::compare((char *)&local_1f0);
  if ((iVar19 == 0) && (this->multi_line == false)) {
    this->multi_line = true;
    peVar5 = (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pbVar6 = (peVar5->file_buff).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar6 == *(_Elt_pointer *)
                   ((long)&(peVar5->file_buff).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_push_back_aux<>(&peVar5->file_buff);
    }
    else {
      (pbVar6->_M_dataplus)._M_p = (pointer)&pbVar6->field_2;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      piVar1 = &(peVar5->file_buff).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  else {
    iVar19 = std::__cxx11::string::compare((char *)&local_1f0);
    if ((iVar19 == 0) && (this->multi_line == true)) {
      this->multi_line = false;
      local_230._M_string_length = 0;
      local_230.field_2._M_local_buf[0] = '\0';
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::swap((string *)&this->line_buff);
      run(this,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p == &local_230.field_2) goto LAB_0015c4b7;
    }
    else {
      lVar12 = std::__cxx11::string::find((char)&local_1f0,0x3a);
      paVar2 = &local_230.field_2;
      local_230._M_string_length = 0;
      local_230.field_2._M_local_buf[0] = '\0';
      local_230._M_dataplus._M_p = (pointer)paVar2;
      if (lVar12 != -1) {
        std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_1f0);
        std::__cxx11::string::operator=((string *)&local_230,(string *)&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_1f0);
        std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
      }
      iVar19 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar19 == 0) {
        local_250._M_dataplus._M_p = local_250._M_dataplus._M_p & 0xffffffff00000000;
        event_type::touch((event_type *)(current_process + 0xd0),&local_250);
      }
      else {
        iVar19 = std::__cxx11::string::compare((char *)&local_1f0);
        if (iVar19 == 0) {
          iVar19 = std::__cxx11::string::compare((char *)&local_230);
          if (iVar19 == 0) {
            this->encoding = ascii;
          }
          else {
            iVar19 = std::__cxx11::string::compare((char *)&local_230);
            if (iVar19 == 0) {
              this->encoding = utf8;
            }
            else {
              iVar19 = std::__cxx11::string::compare((char *)&local_230);
              if (iVar19 != 0) {
                peVar14 = (exception *)__cxa_allocate_exception(0x90);
                sVar7 = this->line_num;
                peVar5 = (this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                pcVar8 = (peVar5->file_path)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,pcVar8,pcVar8 + (peVar5->file_path)._M_string_length
                          );
                std::operator+(&local_210,"@",&local_1f0);
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_210);
                local_250._M_dataplus._M_p = (pointer)*plVar15;
                psVar16 = (size_type *)(plVar15 + 2);
                if ((size_type *)local_250._M_dataplus._M_p == psVar16) {
                  local_250.field_2._M_allocated_capacity = *psVar16;
                  local_250.field_2._8_8_ = plVar15[3];
                  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                }
                else {
                  local_250.field_2._M_allocated_capacity = *psVar16;
                }
                local_250._M_string_length = plVar15[1];
                *plVar15 = (long)psVar16;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                std::operator+(&local_50,&local_250,&local_230);
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_150,"Unavailable encoding.","");
                exception::exception(peVar14,sVar7,&local_110,&local_50,&local_150);
                __cxa_throw(peVar14,&exception::typeinfo,exception::~exception);
              }
              this->encoding = gbk;
            }
          }
        }
        else {
          iVar19 = std::__cxx11::string::compare((char *)&local_1f0);
          if (iVar19 != 0) {
            peVar14 = (exception *)__cxa_allocate_exception(0x90);
            sVar7 = this->line_num;
            peVar5 = (this->context).
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            pcVar8 = (peVar5->file_path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar8,pcVar8 + (peVar5->file_path)._M_string_length);
            std::operator+(&local_250,"@",&local_1f0);
            if (local_230._M_string_length == 0) {
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
            }
            else {
              std::operator+(&local_210,": ",&local_230);
            }
            std::operator+(&local_f0,&local_250,&local_210);
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_190,"Wrong grammar for preprocessor command.","");
            exception::exception(peVar14,sVar7,&local_130,&local_f0,&local_190);
            __cxa_throw(peVar14,&exception::typeinfo,exception::~exception);
          }
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"210508","");
          sVar4 = local_230._M_string_length;
          sVar17 = local_230._M_string_length;
          if (local_250._M_string_length < local_230._M_string_length) {
            sVar17 = local_250._M_string_length;
          }
          if (sVar17 == 0) {
            uVar13 = 0;
          }
          else {
            uVar11 = memcmp(local_230._M_dataplus._M_p,local_250._M_dataplus._M_p,sVar17);
            uVar13 = (ulong)uVar11;
          }
          if ((int)uVar13 == 0) {
            uVar13 = 0xffffffff80000000;
            if (-0x80000000 < (long)(sVar4 - local_250._M_string_length)) {
              uVar13 = sVar4 - local_250._M_string_length;
            }
            if (0x7ffffffe < (long)uVar13) {
              uVar13 = 0x7fffffff;
            }
          }
          if (0 < (int)uVar13) {
            peVar14 = (exception *)__cxa_allocate_exception(0x90);
            sVar7 = this->line_num;
            peVar5 = (this->context).
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            pcVar8 = (peVar5->file_path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,pcVar8,pcVar8 + (peVar5->file_path)._M_string_length);
            std::operator+(&local_90,"@",&local_1f0);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_210._M_dataplus._M_p = (pointer)*plVar15;
            psVar16 = (size_type *)(plVar15 + 2);
            if ((size_type *)local_210._M_dataplus._M_p == psVar16) {
              local_210.field_2._M_allocated_capacity = *psVar16;
              local_210.field_2._8_8_ = plVar15[3];
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            }
            else {
              local_210.field_2._M_allocated_capacity = *psVar16;
            }
            local_210._M_string_length = plVar15[1];
            *plVar15 = (long)psVar16;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::operator+(&local_70,&local_210,&local_230);
            std::operator+(&local_d0,"Newer Language Standard required: ",&local_230);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_1b0._M_dataplus._M_p = (pointer)*plVar15;
            psVar16 = (size_type *)(plVar15 + 2);
            if ((size_type *)local_1b0._M_dataplus._M_p == psVar16) {
              local_1b0.field_2._M_allocated_capacity = *psVar16;
              local_1b0.field_2._8_8_ = plVar15[3];
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar16;
            }
            local_1b0._M_string_length = plVar15[1];
            *plVar15 = (long)psVar16;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::operator+(&local_b0,&local_1b0,&local_250);
            exception::exception(peVar14,sVar7,&local_170,&local_70,&local_b0);
            __cxa_throw(peVar14,&exception::typeinfo,exception::~exception);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
        }
      }
      peVar5 = (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pbVar6 = (peVar5->file_buff).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar6 == *(_Elt_pointer *)
                     ((long)&(peVar5->file_buff).
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_push_back_aux<>(&peVar5->file_buff);
      }
      else {
        (pbVar6->_M_dataplus)._M_p = (pointer)&pbVar6->field_2;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        piVar1 = &(peVar5->file_buff).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p == paVar2) goto LAB_0015c4b7;
    }
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
LAB_0015c4b7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void repl::exec(const string &code)
	{
		// Preprocess
		++line_num;
		int mode = 0;
		for (auto &ch: code) {
			if (mode == 0) {
				if (!std::isspace(ch)) {
					switch (ch) {
					case '#':
						context->file_buff.emplace_back();
						return;
					case '@':
						mode = 1;
						break;
					default:
						mode = -1;
					}
				}
			}
			else if (mode == 1) {
				if (!std::isspace(ch))
					cmd_buff.push_back(ch);
			}
			else
				break;
		}
		switch (mode) {
		default:
			break;
		case 0:
			return;
		case 1: {
			std::string cmd;
			std::swap(cmd_buff, cmd);
			if (cmd == "begin" && !multi_line) {
				multi_line = true;
				context->file_buff.emplace_back();
			}
			else if (cmd == "end" && multi_line) {
				multi_line = false;
				std::string line;
				std::swap(line_buff, line);
				this->run(line);
			}
			else {
				auto pos = cmd.find(':');
				std::string arg;
				if (pos != std::string::npos) {
					arg = cmd.substr(pos + 1);
					cmd = cmd.substr(0, pos);
				}
				if (cmd == "exit") {
					int code = 0;
					current_process->on_process_exit.touch(&code);
				}
				else if (cmd == "charset") {
					if (arg == "ascii")
						encoding = charset::ascii;
					else if (arg == "utf8")
						encoding = charset::utf8;
					else if (arg == "gbk")
						encoding = charset::gbk;
					else
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Unavailable encoding.");
				}
				else if (cmd == "require") {
					std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
					if (arg > version_str)
						throw exception(line_num, context->file_path, "@" + cmd + ": " + arg,
						                "Newer Language Standard required: " + arg + ", now on " + version_str);
				}
				else
					throw exception(line_num, context->file_path, "@" + cmd + (arg.empty() ? "" : ": " + arg),
					                "Wrong grammar for preprocessor command.");
				context->file_buff.emplace_back();
			}
			return;
		}
		}
		if (multi_line) {
			context->file_buff.emplace_back();
			line_buff.append(code);
		}
		else {
			context->file_buff.emplace_back(code);
			this->run(code);
		}
	}